

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

CURLcode curl_mime_type(curl_mimepart *part,char *mimetype)

{
  char *pcVar1;
  
  if (part == (curl_mimepart *)0x0) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  (*Curl_cfree)(part->mimetype);
  part->mimetype = (char *)0x0;
  if (mimetype != (char *)0x0) {
    pcVar1 = (*Curl_cstrdup)(mimetype);
    part->mimetype = pcVar1;
    if (pcVar1 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode curl_mime_type(curl_mimepart *part, const char *mimetype)
{
  if(!part)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  Curl_safefree(part->mimetype);

  if(mimetype) {
    part->mimetype = strdup(mimetype);
    if(!part->mimetype)
      return CURLE_OUT_OF_MEMORY;
  }

  return CURLE_OK;
}